

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O3

void blend_untransformed_generic(int count,QT_FT_Span *spans,void *userData)

{
  char cVar1;
  int iVar2;
  QThreadPool *pQVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long in_FS_OFFSET;
  QSemaphore semaphore;
  Operator op;
  undefined1 *local_120;
  anon_class_48_9_5c990f07 local_118;
  Operator local_e8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  memcpy(&local_e8,&DAT_006ce8d0,0xb0);
  getOperator(&local_e8,(QSpanData *)userData,spans,count);
  local_118.const_alpha = *(int *)((long)userData + 0xe8);
  local_118.yoff =
       -(int)((double)((ulong)-*(double *)((long)userData + 0x78) & 0x8000000000000000 |
                      0x3fe0000000000000) - *(double *)((long)userData + 0x78));
  local_118.xoff =
       -(int)((double)((ulong)-*(double *)((long)userData + 0x70) & 0x8000000000000000 |
                      0x3fe0000000000000) - *(double *)((long)userData + 0x70));
  local_118._25_3_ = 0xaaaaaa;
  local_118.solidSource =
       local_e8.destFetch != destFetchARGB32P &&
       (local_118.const_alpha == 0x100 && local_e8.mode == CompositionMode_Source);
  local_118.image_width = (int)*(undefined8 *)((long)userData + 0xb0);
  local_118.image_height = (int)((ulong)*(undefined8 *)((long)userData + 0xb0) >> 0x20);
  iVar8 = count + 0x5f;
  if (-1 < count + 0x20) {
    iVar8 = count + 0x20;
  }
  local_118.op = &local_e8;
  local_118.spans = spans;
  local_118.data = (QSpanData *)userData;
  pQVar3 = QGuiApplicationPrivate::qtGuiThreadPool();
  if (((0x5f < count) && (pQVar3 != (QThreadPool *)0x0)) &&
     (2 < (int)qPixelLayouts[*(uint *)(*userData + 0x10)].bpp)) {
    QThread::currentThread();
    cVar1 = QThreadPool::contains((QThread *)pQVar3);
    if (cVar1 == '\0') {
      iVar8 = iVar8 >> 6;
      local_120 = &DAT_aaaaaaaaaaaaaaaa;
      iVar7 = 0;
      QSemaphore::QSemaphore((QSemaphore *)&local_120,0);
      iVar2 = 1;
      if (1 < iVar8) {
        iVar2 = iVar8;
      }
      iVar9 = 0;
      do {
        iVar6 = (count - iVar9) / (iVar8 + iVar7);
        puVar4 = (undefined8 *)operator_new(0x18);
        *(undefined1 *)(puVar4 + 1) = 1;
        *puVar4 = QFactoryLoader::keyMap;
        puVar5 = (undefined8 *)operator_new(0x20);
        *puVar5 = QRunnable::QGenericRunnable::
                  Helper<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/painting/qdrawhelper.cpp:4409:5)>
                  ::impl;
        *(int *)(puVar5 + 1) = iVar9;
        *(int *)((long)puVar5 + 0xc) = iVar6;
        puVar5[2] = &local_118;
        puVar5[3] = &local_120;
        puVar4[2] = puVar5;
        QThreadPool::start((QRunnable *)pQVar3,(int)puVar4);
        iVar9 = iVar9 + iVar6;
        iVar7 = iVar7 + -1;
      } while (-iVar2 != iVar7);
      QSemaphore::acquire((int)(QSemaphore *)&local_120);
      QSemaphore::~QSemaphore((QSemaphore *)&local_120);
      goto LAB_00656c63;
    }
  }
  blend_untransformed_generic::anon_class_48_9_5c990f07::operator()(&local_118,0,count);
LAB_00656c63:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void blend_untransformed_generic(int count, const QT_FT_Span *spans, void *userData)
{
    QSpanData *data = reinterpret_cast<QSpanData *>(userData);

    const Operator op = getOperator(data, spans, count);

    const int image_width = data->texture.width;
    const int image_height = data->texture.height;
    const int const_alpha = data->texture.const_alpha;
    const int xoff = -qRound(-data->dx);
    const int yoff = -qRound(-data->dy);
    const bool solidSource = op.mode == QPainter::CompositionMode_Source && const_alpha == 256 && op.destFetch != destFetchARGB32P;

    auto function = [=, &op] (int cStart, int cEnd)
    {
        alignas(16) Q_DECL_UNINITIALIZED uint buffer[BufferSize];
        alignas(16) Q_DECL_UNINITIALIZED uint src_buffer[BufferSize];
        for (int c = cStart; c < cEnd; ++c) {
            if (!spans[c].len)
                continue;
            int x = spans[c].x;
            int length = spans[c].len;
            int sx = xoff + x;
            int sy = yoff + spans[c].y;
            const bool fetchDest = !solidSource || spans[c].coverage < 255;
            if (sy >= 0 && sy < image_height && sx < image_width) {
                if (sx < 0) {
                    x -= sx;
                    length += sx;
                    sx = 0;
                }
                if (sx + length > image_width)
                    length = image_width - sx;
                if (length > 0) {
                    const int coverage = (spans[c].coverage * const_alpha) >> 8;
                    while (length) {
                        int l = qMin(BufferSize, length);
                        const uint *src = op.srcFetch(src_buffer, &op, data, sy, sx, l);
                        uint *dest = fetchDest ? op.destFetch(buffer, data->rasterBuffer, x, spans[c].y, l) : buffer;
                        op.func(dest, src, l, coverage);
                        if (op.destStore)
                            op.destStore(data->rasterBuffer, x, spans[c].y, dest, l);
                        x += l;
                        sx += l;
                        length -= l;
                    }
                }
            }
        }
    };
    QT_THREAD_PARALLEL_FILLS(function);
}